

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O0

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
sequence<toml::detail::either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>>
::
invoke<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc,
          region<std::vector<char,_std::allocator<char>_>_> *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  bool bVar1;
  value_type *other;
  region<std::vector<char,_std::allocator<char>_>_> *v;
  success<toml::detail::region<std::vector<char,_std::allocator<char>_>_>_> local_e0;
  undefined4 local_98;
  failure_type local_81;
  region<std::vector<char,_std::allocator<char>_>_> *local_80;
  undefined1 local_78 [8];
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  region<std::vector<char,_std::allocator<char>_>_> *reg_local;
  location<std::vector<char,_std::allocator<char>_>_> *loc_local;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first_local;
  
  rslt.field_1.succ.value.last_._M_current = (const_iterator)loc;
  either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>
  ::invoke<std::vector<char,std::allocator<char>>>
            ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
              *)local_78,
             (either<toml::detail::sequence<toml::detail::in_range<(char)49,(char)57>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::sequence<toml::detail::character<(char)95>,toml::detail::in_range<(char)48,(char)57>>>,toml::detail::at_least<1ul>>>,toml::detail::in_range<(char)48,(char)57>>
              *)this,loc);
  bVar1 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
          ::is_err((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                    *)local_78);
  if (bVar1) {
    local_80 = reg;
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,(const_iterator)reg);
    none();
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,&local_81);
  }
  else {
    other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_78);
    region<std::vector<char,_std::allocator<char>_>_>::operator+=
              ((region<std::vector<char,_std::allocator<char>_>_> *)loc,other);
    ok<toml::detail::region<std::vector<char,std::allocator<char>>>&>(&local_e0,(toml *)loc,v);
    result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
    result(__return_storage_ptr__,&local_e0);
    success<toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::~success(&local_e0);
  }
  local_98 = 1;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  ~result((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *)local_78);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return ok(reg);
    }